

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_void>
::to_json(json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_void>
          *this,pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *val)

{
  undefined8 extraout_RDX;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  undefined1 local_11;
  
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,&local_11);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve
            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,2);
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::push_back<bool_const&>
            ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)this,&val->first);
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
  push_back<std::__cxx11::wstring_const&>
            ((basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>> *)this,&val->second);
  bVar1.field_0.int64_.val_ = extraout_RDX;
  bVar1.field_0._0_8_ = this;
  return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
}

Assistant:

static Json to_json(const std::pair<T1,T2>& val)
        {
            Json j(json_array_arg);
            j.reserve(2);
            j.push_back(val.first);
            j.push_back(val.second);
            return j;
        }